

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# persistent_storage_json.hpp
# Opt level: O3

Status __thiscall
ot::commissioner::persistent_storage::PersistentStorageJson::
LookupPred<ot::commissioner::persistent_storage::Registrar>
          (PersistentStorageJson *this,
          function<bool_(const_ot::commissioner::persistent_storage::Registrar_&)> *aPred,
          vector<ot::commissioner::persistent_storage::Registrar,_std::allocator<ot::commissioner::persistent_storage::Registrar>_>
          *aRet,string *aArrName)

{
  pointer pRVar1;
  pointer pRVar2;
  iterator result_1;
  iterator result;
  _Any_data local_90;
  code *local_80;
  iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
  local_70;
  iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
  local_50;
  
  pRVar1 = (aRet->
           super__Vector_base<ot::commissioner::persistent_storage::Registrar,_std::allocator<ot::commissioner::persistent_storage::Registrar>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pRVar2 = (aRet->
           super__Vector_base<ot::commissioner::persistent_storage::Registrar,_std::allocator<ot::commissioner::persistent_storage::Registrar>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  local_50.m_object =
       nlohmann::
       basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
       ::operator[](&this->mCache,aArrName);
  local_50.m_it.object_iterator._M_node = (_Base_ptr)0x0;
  local_50.m_it.array_iterator._M_current =
       (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
        *)0x0;
  local_50.m_it.primitive_iterator.m_it = -0x8000000000000000;
  nlohmann::detail::
  iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
  ::set_begin(&local_50);
  local_70.m_object =
       nlohmann::
       basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
       ::operator[](&this->mCache,aArrName);
  local_70.m_it.object_iterator._M_node = (_Base_ptr)0x0;
  local_70.m_it.array_iterator._M_current =
       (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
        *)0x0;
  local_70.m_it.primitive_iterator.m_it = -0x8000000000000000;
  nlohmann::detail::
  iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
  ::set_end(&local_70);
  std::function<bool_(const_ot::commissioner::persistent_storage::Registrar_&)>::function
            ((function<bool_(const_ot::commissioner::persistent_storage::Registrar_&)> *)&local_90,
             aPred);
  std::
  copy_if<nlohmann::detail::iter_impl<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>,std::back_insert_iterator<std::vector<ot::commissioner::persistent_storage::Registrar,std::allocator<ot::commissioner::persistent_storage::Registrar>>>,std::function<bool(ot::commissioner::persistent_storage::Registrar_const&)>>
            (&local_50,&local_70,
             (back_insert_iterator<std::vector<ot::commissioner::persistent_storage::Registrar,_std::allocator<ot::commissioner::persistent_storage::Registrar>_>_>
              )aRet,(function<bool_(const_ot::commissioner::persistent_storage::Registrar_&)> *)
                    &local_90);
  if (local_80 != (code *)0x0) {
    (*local_80)(&local_90,&local_90,__destroy_functor);
  }
  return (ulong)((long)(aRet->
                       super__Vector_base<ot::commissioner::persistent_storage::Registrar,_std::allocator<ot::commissioner::persistent_storage::Registrar>_>
                       )._M_impl.super__Vector_impl_data._M_finish -
                (long)(aRet->
                      super__Vector_base<ot::commissioner::persistent_storage::Registrar,_std::allocator<ot::commissioner::persistent_storage::Registrar>_>
                      )._M_impl.super__Vector_impl_data._M_start) <=
         (ulong)((long)pRVar2 - (long)pRVar1);
}

Assistant:

Status LookupPred(std::function<bool(V const &)> aPred, std::vector<V> &aRet, std::string aArrName)
    {
        size_t prevSize = aRet.size();
        std::copy_if(std::begin(mCache[aArrName]), std::end(mCache[aArrName]), std::back_inserter(aRet), aPred);

        if (aRet.size() > prevSize)
        {
            return Status::kSuccess;
        }

        return Status::kNotFound;
    }